

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_move
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t destination,sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_tuple_t array;
  sysbvm_tuple_t instruction;
  sysbvm_tuple_t operands;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t destination_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_functionBytecodeAssembler_isLocalVectorOperand(destination);
  if (_Var1) {
    array = sysbvm_array_create(context,2);
    sysbvm_array_atPut(array,0,destination);
    sysbvm_array_atPut(array,1,value);
    context_local =
         (sysbvm_context_t *)sysbvm_functionBytecodeAssemblerInstruction_create(context,'!',array);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler,(sysbvm_tuple_t)context_local);
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_move(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t destination, sysbvm_tuple_t value)
{
    if(!sysbvm_functionBytecodeAssembler_isLocalVectorOperand(destination))
        return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_t operands = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(operands, 0, destination);
    sysbvm_array_atPut(operands, 1, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_MOVE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}